

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O2

char * ngx_http_rewrite_value(ngx_conf_t *cf,ngx_http_rewrite_loc_conf_t *lcf,ngx_str_t *value)

{
  ngx_uint_t nVar1;
  undefined8 *puVar2;
  ngx_int_t nVar3;
  ngx_http_script_compile_t local_80;
  
  nVar1 = ngx_http_script_variables_count(value);
  if (nVar1 == 0) {
    puVar2 = (undefined8 *)ngx_http_script_start_code(cf->pool,&lcf->codes,0x20);
    if (puVar2 != (undefined8 *)0x0) {
      nVar3 = ngx_atoi(value->data,value->len);
      if (nVar3 == -1) {
        nVar3 = 0;
      }
      *puVar2 = ngx_http_script_value_code;
      puVar2[1] = nVar3;
      puVar2[2] = value->len;
      puVar2[3] = value->data;
      return (char *)0x0;
    }
  }
  else {
    puVar2 = (undefined8 *)ngx_http_script_start_code(cf->pool,&lcf->codes,0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = ngx_http_script_complex_value_code;
      puVar2[1] = 0;
      local_80.lengths = (ngx_array_t **)(puVar2 + 1);
      local_80.flushes = (ngx_array_t **)0x0;
      local_80.size = 0;
      local_80.main = (void *)0x0;
      local_80.ncaptures = 0;
      local_80.captures_mask = 0;
      local_80._80_8_ = 2;
      local_80.cf = cf;
      local_80.source = value;
      local_80.values = &lcf->codes;
      local_80.variables = nVar1;
      nVar3 = ngx_http_script_compile(&local_80);
      return (char *)-(ulong)(nVar3 != 0);
    }
  }
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_rewrite_value(ngx_conf_t *cf, ngx_http_rewrite_loc_conf_t *lcf,
    ngx_str_t *value)
{
    ngx_int_t                              n;
    ngx_http_script_compile_t              sc;
    ngx_http_script_value_code_t          *val;
    ngx_http_script_complex_value_code_t  *complex;

    n = ngx_http_script_variables_count(value);

    if (n == 0) {
        val = ngx_http_script_start_code(cf->pool, &lcf->codes,
                                         sizeof(ngx_http_script_value_code_t));
        if (val == NULL) {
            return NGX_CONF_ERROR;
        }

        n = ngx_atoi(value->data, value->len);

        if (n == NGX_ERROR) {
            n = 0;
        }

        val->code = ngx_http_script_value_code;
        val->value = (uintptr_t) n;
        val->text_len = (uintptr_t) value->len;
        val->text_data = (uintptr_t) value->data;

        return NGX_CONF_OK;
    }

    complex = ngx_http_script_start_code(cf->pool, &lcf->codes,
                                 sizeof(ngx_http_script_complex_value_code_t));
    if (complex == NULL) {
        return NGX_CONF_ERROR;
    }

    complex->code = ngx_http_script_complex_value_code;
    complex->lengths = NULL;

    ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

    sc.cf = cf;
    sc.source = value;
    sc.lengths = &complex->lengths;
    sc.values = &lcf->codes;
    sc.variables = n;
    sc.complete_lengths = 1;

    if (ngx_http_script_compile(&sc) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}